

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void djb::brdf::hd_to_io(vec3 *wh,vec3 *wd,vec3 *wi,vec3 *wo)

{
  float_t fVar1;
  vec3 vVar2;
  undefined8 local_100;
  float_t local_f8;
  vec3 local_f0;
  vec3 local_e0;
  vec3 local_d0;
  vec3 local_c0 [2];
  vec3 local_a8;
  vec3 local_98;
  vec3 local_88;
  undefined8 local_78;
  float_t local_70;
  vec3 local_68;
  undefined1 local_58 [8];
  vec3 tmp;
  float_t local_44;
  float_t phi_h;
  float_t theta_h;
  vec3 z;
  vec3 y;
  vec3 *wo_local;
  vec3 *wi_local;
  vec3 *wd_local;
  vec3 *wh_local;
  
  vec3::vec3((vec3 *)&z.y,0.0,1.0,0.0);
  vec3::vec3((vec3 *)&phi_h,0.0,0.0,1.0);
  xyz_to_theta_phi(wh,&local_44,&tmp.z);
  vVar2 = rotate_vector(wd,(vec3 *)&z.y,local_44);
  local_68.z = vVar2.z;
  tmp.x = local_68.z;
  local_68._0_8_ = vVar2._0_8_;
  local_58._0_4_ = local_68.x;
  local_58._4_4_ = local_68.y;
  local_68 = vVar2;
  vVar2 = rotate_vector((vec3 *)local_58,(vec3 *)&phi_h,tmp.z);
  local_98.z = vVar2.z;
  local_88.z = local_98.z;
  local_98._0_8_ = vVar2._0_8_;
  local_88.x = local_98.x;
  local_88.y = local_98.y;
  local_98 = vVar2;
  vVar2 = normalize(&local_88);
  local_a8.z = vVar2.z;
  local_70 = local_a8.z;
  local_a8._0_8_ = vVar2._0_8_;
  local_78._0_4_ = local_a8.x;
  local_78._4_4_ = local_a8.y;
  wi->z = local_a8.z;
  wi->x = local_a8.x;
  wi->y = local_a8.y;
  local_a8 = vVar2;
  fVar1 = dot(wi,wh);
  vVar2 = djb::operator*(fVar1 + fVar1,wh);
  local_e0.z = vVar2.z;
  local_d0.z = local_e0.z;
  local_e0._0_8_ = vVar2._0_8_;
  local_d0.x = local_e0.x;
  local_d0.y = local_e0.y;
  vVar2 = djb::operator-(&local_d0,wi);
  local_f0.z = vVar2.z;
  local_c0[0].z = local_f0.z;
  local_f0._0_8_ = vVar2._0_8_;
  local_c0[0].x = local_f0.x;
  local_c0[0].y = local_f0.y;
  vVar2 = normalize(local_c0);
  local_100 = vVar2._0_8_;
  local_f8 = vVar2.z;
  wo->x = (float_t)(undefined4)local_100;
  wo->y = (float_t)local_100._4_4_;
  wo->z = local_f8;
  return;
}

Assistant:

void brdf::hd_to_io(const vec3 &wh, const vec3 &wd, vec3 *wi, vec3 *wo)
{
	const vec3 y = vec3(0, 1, 0);
	const vec3 z = vec3(0, 0, 1);
	float_t theta_h, phi_h;

	xyz_to_theta_phi(wh, &theta_h, &phi_h);
	vec3 tmp = rotate_vector(wd, y, theta_h);
	(*wi) = normalize(rotate_vector(tmp, z, phi_h));
	(*wo) = normalize(2 * dot((*wi), wh) * wh - (*wi));
}